

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O3

bool __thiscall
prometheus::detail::MetricsHandler::handleGet
          (MetricsHandler *this,CivetServer *param_1,mg_connection *conn)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  pointer len;
  void *unaff_R13;
  undefined1 auVar6 [16];
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined8 local_d8;
  long local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b8;
  TextSerializer serializer;
  z_stream zs;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_c8._M_allocated_capacity = 0;
  local_c8._8_8_ = 0;
  local_b8 = (pointer)0x0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->collectables_mutex_);
  if (iVar1 != 0) {
    uVar5 = std::__throw_system_error(iVar1);
    if (unaff_R13 != (void *)0x0) {
      operator_delete(unaff_R13);
    }
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
               &local_c8);
    _Unwind_Resume(uVar5);
  }
  CollectMetrics((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                 local_108,&this->collectables_);
  zs.total_in = (uLong)local_b8;
  zs._8_8_ = local_c8._8_8_;
  zs.next_in = (Bytef *)local_c8._M_allocated_capacity;
  local_b8 = (pointer)local_108._16_8_;
  local_c8._M_allocated_capacity = local_108._0_8_;
  local_c8._8_8_ = local_108._8_8_;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)&zs);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             local_108);
  pthread_mutex_unlock((pthread_mutex_t *)&this->collectables_mutex_);
  serializer.super_Serializer._vptr_Serializer = (Serializer)&PTR__Serializer_0013ad20;
  Serializer::Serialize_abi_cxx11_
            ((string *)local_108,&serializer.super_Serializer,
             (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             &local_c8);
  mg_printf(conn,"HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=utf-8\r\n");
  pcVar3 = mg_get_header(conn,"Accept-Encoding");
  if ((pcVar3 != (char *)0x0) && (pcVar3 = strstr(pcVar3,"gzip"), pcVar3 != (char *)0x0)) {
    zs.adler = 0;
    zs.reserved = 0;
    zs.opaque = (voidpf)0x0;
    zs.data_type = 0;
    zs._92_4_ = 0;
    zs.zalloc = (alloc_func)0x0;
    zs.zfree = (free_func)0x0;
    zs.msg = (char *)0x0;
    zs.state = (internal_state *)0x0;
    zs.avail_out = 0;
    zs._36_4_ = 0;
    zs.total_out = 0;
    zs.total_in = 0;
    zs.next_out = (Bytef *)0x0;
    zs.next_in = (Bytef *)0x0;
    zs.avail_in = 0;
    zs._12_4_ = 0;
    iVar1 = deflateInit2_(&zs,0xffffffff,8,0x1f,9,0,"1.2.11",0x70);
    if (iVar1 == 0) {
      zs.next_in = (Bytef *)local_108._0_8_;
      zs.avail_in = (uInt)local_108._8_8_;
      local_e8._M_allocated_capacity = 0;
      local_e8._8_8_ = (void *)0x0;
      local_d8 = 0;
      local_d0 = lVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
                 (ulong)local_108._8_8_ >> 1);
      do {
        zs.avail_out = 0x8000;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
                   zs.total_out + 0x8000);
        zs.next_out = (Bytef *)(local_e8._M_allocated_capacity + zs.total_out);
        iVar1 = deflate(&zs,4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,zs.total_out);
      } while (iVar1 == 0);
      deflateEnd(&zs);
      lVar2 = local_d0;
      uVar5 = local_e8._M_allocated_capacity;
      if ((iVar1 == 1) && (local_e8._M_allocated_capacity != local_e8._8_8_)) {
        len = (pointer)(local_e8._8_8_ - local_e8._0_8_);
        mg_printf(conn,"Content-Encoding: gzip\r\nContent-Length: %lu\r\n\r\n",len);
        mg_write(conn,(void *)uVar5,(size_t)len);
        if ((void *)uVar5 != (void *)0x0) {
          operator_delete((void *)uVar5);
        }
        goto LAB_0011b843;
      }
      if ((void *)local_e8._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_e8._M_allocated_capacity);
      }
    }
  }
  mg_printf(conn,"Content-Length: %lu\r\n\r\n",local_108._8_8_);
  mg_write(conn,(void *)local_108._0_8_,local_108._8_8_);
  len = (pointer)local_108._8_8_;
LAB_0011b843:
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  Summary::Observe(this->request_latencies_,(double)((lVar4 - lVar2) / 1000));
  auVar6._8_4_ = (int)((ulong)len >> 0x20);
  auVar6._0_8_ = len;
  auVar6._12_4_ = 0x45300000;
  Counter::Increment(this->bytes_transferred_,
                     (auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0));
  Counter::Increment(this->num_scrapes_);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             &local_c8);
  return true;
}

Assistant:

bool MetricsHandler::handleGet(CivetServer*, struct mg_connection* conn) {
  auto start_time_of_request = std::chrono::steady_clock::now();

  std::vector<MetricFamily> metrics;

  {
    std::lock_guard<std::mutex> lock{collectables_mutex_};
    metrics = CollectMetrics(collectables_);
  }

  const TextSerializer serializer;

  auto bodySize = WriteResponse(conn, serializer.Serialize(metrics));

  auto stop_time_of_request = std::chrono::steady_clock::now();
  auto duration = std::chrono::duration_cast<std::chrono::microseconds>(
      stop_time_of_request - start_time_of_request);
  request_latencies_.Observe(duration.count());

  bytes_transferred_.Increment(bodySize);
  num_scrapes_.Increment();
  return true;
}